

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigFeed.c
# Opt level: O2

void Fraig_FeedBackInit(Fraig_Man_t *p)

{
  Fraig_NodeVec_t *pFVar1;
  Msat_IntVec_t *pMVar2;
  uint *puVar3;
  
  pFVar1 = Fraig_NodeVecAlloc(500);
  p->vCones = pFVar1;
  pMVar2 = Msat_IntVecAlloc(1000);
  p->vPatsReal = pMVar2;
  puVar3 = (uint *)Fraig_MemFixedEntryFetch(p->mmSims);
  p->pSimsReal = puVar3;
  memset(puVar3,0,(long)p->nWordsDyna << 2);
  puVar3 = (uint *)Fraig_MemFixedEntryFetch(p->mmSims);
  p->pSimsTemp = puVar3;
  puVar3 = (uint *)Fraig_MemFixedEntryFetch(p->mmSims);
  p->pSimsDiff = puVar3;
  return;
}

Assistant:

void Fraig_FeedBackInit( Fraig_Man_t * p )
{
    p->vCones    = Fraig_NodeVecAlloc( 500 );
    p->vPatsReal = Msat_IntVecAlloc( 1000 ); 
    p->pSimsReal = (unsigned *)Fraig_MemFixedEntryFetch( p->mmSims );
    memset( p->pSimsReal, 0, sizeof(unsigned) * p->nWordsDyna );
    p->pSimsTemp = (unsigned *)Fraig_MemFixedEntryFetch( p->mmSims );
    p->pSimsDiff = (unsigned *)Fraig_MemFixedEntryFetch( p->mmSims );
}